

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

bool __thiscall
tinyusdz::TypedAttribute<tinyusdz::value::vector3f>::is_value_empty
          (TypedAttribute<tinyusdz::value::vector3f> *this)

{
  bool bVar1;
  TypedAttribute<tinyusdz::value::vector3f> *this_local;
  
  bVar1 = has_connections(this);
  if (bVar1) {
    this_local._7_1_ = false;
  }
  else {
    bVar1 = nonstd::optional_lite::optional<tinyusdz::value::vector3f>::has_value
                      ((optional<tinyusdz::value::vector3f> *)(this + 0x228));
    if (bVar1) {
      this_local._7_1_ = false;
    }
    else if (((byte)this[0x238] & 1) == 0) {
      this_local._7_1_ = (bool)((byte)this[0x208] & 1);
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool is_value_empty() const {
    if (has_connections()) {
      return false;
    }

    if (_attrib.has_value()) {
      return false;
    }

    if (_blocked) {
      return false;
    }

    return _value_empty;
  }